

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O3

EData * get_edges(LGraph G)

{
  int iVar1;
  EData *pEVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  pEVar2 = (EData *)malloc((long)in_stack_0000000c << 3);
  if (0 < (long)in_stack_00000008) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      piVar5 = *(int **)(G.vexs + lVar3);
      if (piVar5 != (int *)0x0) {
        do {
          iVar1 = *piVar5;
          if (lVar3 < iVar1) {
            pEVar2[iVar4].start = *(char *)&G.vexs[lVar3 + -1].first_edge;
            pEVar2[iVar4].end = *(char *)&G.vexs[(long)iVar1 + -1].first_edge;
            pEVar2[iVar4].weight = piVar5[1];
            iVar4 = iVar4 + 1;
          }
          piVar5 = *(int **)(piVar5 + 2);
        } while (piVar5 != (int *)0x0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != in_stack_00000008);
  }
  return pEVar2;
}

Assistant:

EData* get_edges(LGraph G)
{
    int i,j;
    int index=0;
    ENode *node;
    EData *edges;

    edges = (EData*)malloc(G.edgnum*sizeof(EData));
    for (i=0; i<G.vexnum; i++)
    {
        node = G.vexs[i].first_edge;
        while (node != NULL)
        {
            if (node->ivex > i)
            {
                edges[index].start  = G.vexs[i].data;           // 起点
                edges[index].end    = G.vexs[node->ivex].data;  // 终点
                edges[index].weight = node->weight;             // 权
                index++;
            }
            node = node->next_edge;
        }
    }

    return edges;
}